

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall
FillableSigningProvider::GetPubKey
          (FillableSigningProvider *this,CKeyID *address,CPubKey *vchPubKeyOut)

{
  byte bVar1;
  void *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  CKey key;
  CKey *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_60 [23];
  undefined1 local_49 [65];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CKey::CKey(in_stack_ffffffffffffff48);
  bVar1 = (**(code **)(*in_RDI + 0x28))(in_RDI,in_RSI,local_60);
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    CKey::GetPubKey((CKey *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    memcpy(in_RDX,local_49,0x41);
  }
  CKey::~CKey(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool FillableSigningProvider::GetPubKey(const CKeyID &address, CPubKey &vchPubKeyOut) const
{
    CKey key;
    if (!GetKey(address, key)) {
        return false;
    }
    vchPubKeyOut = key.GetPubKey();
    return true;
}